

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RecyclerWriteBarrierManager.cpp
# Opt level: O0

bool __thiscall
Memory::X64WriteBarrierCardTableManager::OnSegmentAlloc
          (X64WriteBarrierCardTableManager *this,char *segmentAddress,size_t numPages)

{
  code *pcVar1;
  bool bVar2;
  BOOLEAN BVar3;
  BVIndex BVar4;
  BVIndex BVar5;
  DWORD DVar6;
  uintptr_t uVar7;
  uintptr_t uVar8;
  BYTE *pBVar9;
  LPVOID pvVar10;
  long lVar11;
  BYTE *lpAddress;
  ulong dwSize;
  undefined8 *in_FS_OFFSET;
  BOOL result;
  BOOLEAN wasSet;
  BVIndex i_1;
  BVIndex BStack_a4;
  OutOfMemoryException anon_var_0;
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  BVIndex sectionIndex;
  LPVOID ret;
  size_t commitSize;
  BYTE *sectionEnd;
  BYTE *sectionStart;
  uintptr_t endIndex;
  uintptr_t startIndex;
  BVIndex local_68;
  BVIndex i;
  bool needCommit;
  BVIndex sectionLastIndex;
  BVIndex sectionStartIndex;
  void *segmentLastWritableAddress;
  void *segmentEndAddress;
  size_t pageSize;
  AutoCriticalSection critSec;
  size_t numPages_local;
  char *segmentAddress_local;
  X64WriteBarrierCardTableManager *this_local;
  
  critSec.cs = (CriticalSection *)numPages;
  if (this->_cardTable == (BYTE *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                       ,0x5e,"(_cardTable)","_cardTable");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
  }
  this->_lastCommitState = CommitStateOnSegmentAlloc;
  if (AutoSystemInfo::Data.super_SYSTEM_INFO.lpMaximumApplicationAddress <= segmentAddress) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    *(undefined4 *)*in_FS_OFFSET = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                       ,100,"(false)","false");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *(undefined4 *)*in_FS_OFFSET = 0;
    this->_lastCommitState = CommitStateFailedMaxAddressExceeded;
    Js::Throw::FatalInternalError(-0x7fffbffb);
  }
  AutoCriticalSection::AutoCriticalSection
            ((AutoCriticalSection *)&pageSize,&this->_cardTableInitCriticalSection);
  lVar11 = (long)critSec.cs * 0x1000;
  BVar4 = GetSectionIndex(this,segmentAddress);
  BVar5 = GetSectionIndex(this,segmentAddress + lVar11 + -1);
  this->_lastSegmentAddress = segmentAddress;
  this->_lastSegmentNumPages = (size_t)critSec.cs;
  this->_lastSectionIndexStart = (ulong)BVar4;
  this->_lastSectionIndexLast = (ulong)BVar5;
  bVar2 = false;
  local_68 = BVar4;
  do {
    if (BVar5 < local_68) {
LAB_00365fc6:
      if (bVar2) {
        this->_lastCommitState = CommitStateOnNeedCommit;
        uVar7 = RecyclerWriteBarrierManager::GetCardTableIndex(segmentAddress);
        uVar8 = RecyclerWriteBarrierManager::GetCardTableIndex(segmentAddress + lVar11);
        if (uVar8 < uVar7) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                             ,0x94,"(startIndex <= endIndex)","startIndex <= endIndex");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        lpAddress = (BYTE *)((ulong)(this->_cardTable + uVar7) & 0xfffffffffffff000);
        pBVar9 = (BYTE *)Math::Align<unsigned_long>
                                   ((unsigned_long)(this->_cardTable + uVar8),0x1000);
        dwSize = (long)pBVar9 - (long)lpAddress;
        this->_lastSectionStart = lpAddress;
        this->_lastSectionEnd = pBVar9;
        if (dwSize == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                             ,0xa1,"(commitSize > 0)","commitSize > 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        if (dwSize % 0x1000 != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                             ,0xa2,"(commitSize % pageSize == 0)","commitSize % pageSize == 0");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        if (dwSize / 0x1000 != (ulong)((BVar5 - BVar4) + 1)) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          *(undefined4 *)*in_FS_OFFSET = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                             ,0xa3,
                             "(commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1)",
                             "commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1");
          if (!bVar2) {
            pcVar1 = (code *)invalidInstructionException();
            (*pcVar1)();
          }
          *(undefined4 *)*in_FS_OFFSET = 0;
        }
        pvVar10 = VirtualAlloc(lpAddress,dwSize,0x1000,4);
        if (pvVar10 == (LPVOID)0x0) {
          DVar6 = GetLastError();
          if (DVar6 == 0x1e7) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *(undefined4 *)*in_FS_OFFSET = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/RecyclerWriteBarrierManager.cpp"
                               ,0xac,"(::GetLastError() != 487L)",
                               "::GetLastError() != ERROR_INVALID_ADDRESS");
            if (!bVar2) {
              pcVar1 = (code *)invalidInstructionException();
              (*pcVar1)();
            }
            *(undefined4 *)*in_FS_OFFSET = 0;
          }
          this->_lastCommitState = CommitStateFailedVirtualAlloc;
          this_local._7_1_ = false;
        }
        else {
          this->_lastCommitState = CommitStateOnSectionCommitted;
          BStack_a4 = BVar4;
          AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)&i_1,ExceptionType_DisableCheck);
          for (; BStack_a4 <= BVar5; BStack_a4 = BStack_a4 + 1) {
            BVSparse<Memory::HeapAllocator>::Set(&committedSections,BStack_a4);
          }
          this->_lastCommitState = CommitStateOnCommitBitSet;
          AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType
                    ((AutoNestedHandledExceptionType *)&i_1);
          this_local._7_1_ = true;
        }
      }
      else {
        this_local._7_1_ = true;
      }
      AutoCriticalSection::~AutoCriticalSection((AutoCriticalSection *)&pageSize);
      return this_local._7_1_;
    }
    BVar3 = BVSparse<Memory::HeapAllocator>::Test(&committedSections,local_68);
    if (BVar3 == '\0') {
      bVar2 = true;
      goto LAB_00365fc6;
    }
    local_68 = local_68 + 1;
  } while( true );
}

Assistant:

bool
X64WriteBarrierCardTableManager::OnSegmentAlloc(_In_ char* segmentAddress, size_t numPages)
{
    Assert(_cardTable);

    SetCommitState(OnSegmentAlloc);

    if (segmentAddress >= AutoSystemInfo::Data.lpMaximumApplicationAddress)
    {
        Assert(false); // How did this happen?
        SetCommitState(FailedMaxAddressExceeded);
        Js::Throw::FatalInternalError();
    }

    AutoCriticalSection critSec(&_cardTableInitCriticalSection);

    size_t  pageSize = AutoSystemInfo::PageSize;

    // First, check if the pages for this segment have already been committed
    // If they have, there is nothing for us to do here.
    void*   segmentEndAddress = segmentAddress + (numPages * pageSize);
    void*   segmentLastWritableAddress = (char*)segmentEndAddress - 1;
    BVIndex sectionStartIndex = GetSectionIndex(segmentAddress);
    BVIndex sectionLastIndex = GetSectionIndex(segmentLastWritableAddress);

#ifdef X64_WB_DIAG
    this->_lastSegmentAddress = segmentAddress;
    this->_lastSegmentNumPages = numPages;
    this->_lastSectionIndexStart = sectionStartIndex;
    this->_lastSectionIndexLast = sectionLastIndex;
#endif

    bool needCommit = false;
    for (BVIndex i = sectionStartIndex; i <= sectionLastIndex; i++)
    {
        if (!committedSections.Test(i))
        {
            needCommit = true;
            break;
        }
    }

    if (!needCommit)
    {
        // The pages for this segment have already been committed.
        // We don't need to do anything more, since write barriers can
        // already be set for writes to this segment
        return true;
    }

    SetCommitState(OnNeedCommit);

    // There are uncommitted pages in this range. We'll commit the full range
    // We might commit some pages that are already committed but that's okay
    const uintptr_t startIndex = RecyclerWriteBarrierManager::GetCardTableIndex(segmentAddress);
    const uintptr_t endIndex   = RecyclerWriteBarrierManager::GetCardTableIndex(segmentEndAddress);

    Assert(startIndex <= endIndex);

    // Section Start is the card table's starting entry aligned *down* to the page boundary
    // Section End is the card table's ending entry aligned *up* to the page boundary
    BYTE* sectionStart = (BYTE*) (((uintptr_t) &_cardTable[startIndex]) & ~(pageSize - 1));
    BYTE* sectionEnd   = (BYTE*) Math::Align<uintptr_t>((uintptr_t)&_cardTable[endIndex], pageSize);
    size_t commitSize  = (sectionEnd - sectionStart);

#ifdef X64_WB_DIAG
    _lastSectionStart = sectionStart;
    _lastSectionEnd = sectionEnd;
#endif

    Assert(commitSize > 0);
    Assert(commitSize % pageSize == 0);
    Assert(commitSize / pageSize == sectionLastIndex - sectionStartIndex + 1);

    LPVOID ret = ::VirtualAlloc((LPVOID) sectionStart, commitSize, MEM_COMMIT, PAGE_READWRITE);
    if (!ret)
    {
        // If this is the error that occurred while trying to commit the page, this likely means
        // that the page we tried to commit is outside out reservation, which means that our reservation
        // was too small. This can happen if Windows increases the maximum process address space size
        // If this happens, X64WriteBarrierCardTableManager::Initialize will have to be updated
        Assert(::GetLastError() != ERROR_INVALID_ADDRESS);
        SetCommitState(FailedVirtualAlloc);
        return false;
    }

    SetCommitState(OnSectionCommitted);
    BVIndex sectionIndex = sectionStartIndex;

    try
    {
#ifdef EXCEPTION_CHECK
        AUTO_NESTED_HANDLED_EXCEPTION_TYPE(ExceptionType_DisableCheck);
#endif

        for (; sectionIndex <= sectionLastIndex; sectionIndex++)
        {
            committedSections.Set(sectionIndex);
        }

        SetCommitState(OnCommitBitSet);
    }
    catch (Js::OutOfMemoryException)
    {
        SetCommitState(FailedCommitBitSet);

        // We ran out of memory allocating a node for the sparse bit vector, so clean up
        // and return false
        // Since setting sectionIndex threw the exception, we don't clear it, we clear until the index before it
        for (BVIndex i = sectionStartIndex; i < sectionIndex; i++)
        {
            BOOLEAN wasSet = committedSections.TestAndClear(i);
            Assert(wasSet == TRUE);
        }

#pragma prefast(suppress:6250, "This method decommits memory")
        BOOL result = ::VirtualFree((LPVOID)sectionStart, commitSize, MEM_DECOMMIT);
        Assert(result != 0);
        return false;
    }

    return true;
}